

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,uint value)

{
  if (*(basic_format_specs<char> **)(this + 0x10) == (basic_format_specs<char> *)0x0) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    write_decimal<unsigned_int>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
               this,value);
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_int<unsigned_int,fmt::v5::basic_format_specs<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,value,*(basic_format_specs<char> **)(this + 0x10));
  }
  return (type)*(basic_buffer<char> **)this;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, iterator>::type
      operator()(T value) {
    // MSVC2013 fails to compile separate overloads for bool and char_type so
    // use std::is_same instead.
    if (std::is_same<T, bool>::value) {
      if (specs_ && specs_->type_)
        return (*this)(value ? 1 : 0);
      write(value != 0);
    } else if (std::is_same<T, char_type>::value) {
      internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    } else {
      specs_ ? writer_.write_int(value, *specs_) : writer_.write(value);
    }
    return out();
  }